

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer *toSeparate;
  char cVar1;
  undefined8 *puVar2;
  undefined1 local_298 [8];
  bool shouldStop;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  byte abStack_278 [496];
  undefined1 auStack_88 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  separated;
  undefined1 local_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tmpV;
  string buffer;
  
  auStack_88 = (undefined1  [8])0x0;
  separated.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  separated.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (argc == 1) {
    _shouldStop = 0;
    local_288._M_local_buf[0] = '\0';
    local_298 = (undefined1  [8])&local_288;
    cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x30);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)local_298,cVar1);
    TextAnalyzer::lexer((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&tmpV.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_298);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_88,
               separated.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               tmpV.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,buffer._M_dataplus._M_p);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&tmpV.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (local_298 != (undefined1  [8])&local_288) {
      operator_delete((void *)local_298,
                      CONCAT71(local_288._M_allocated_capacity._1_7_,local_288._M_local_buf[0]) + 1)
      ;
    }
  }
  else {
    if (argc != 2) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = "invalid arguments!";
      __cxa_throw(puVar2,&char_const*::typeinfo,0);
    }
    std::fstream::fstream(local_298);
    buffer._M_dataplus._M_p = (pointer)0x0;
    buffer._M_string_length._0_1_ = 0;
    tmpV.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&buffer._M_string_length;
    std::fstream::open(local_298,(_Ios_Openmode)argv[1]);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = "cannot open file!";
      __cxa_throw(puVar2,&char_const*::typeinfo,0);
    }
    cVar1 = std::ios::widen((char)local_298 + (char)*(undefined8 *)((long)local_298 + -0x18));
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_298,
               (string *)
               &tmpV.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,cVar1);
    if ((abStack_278[*(long *)((long)local_298 + -0x18)] & 2) == 0) {
      toSeparate = &tmpV.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
      do {
        TextAnalyzer::lexer((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_68,(string *)toSeparate);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_88,
                   separated.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,local_68,
                   tmpV.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        cVar1 = std::ios::widen((char)*(undefined8 *)((long)local_298 + -0x18) +
                                (char)(istream *)local_298);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_298,(string *)toSeparate,cVar1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_68);
      } while ((abStack_278[*(long *)((long)local_298 + -0x18)] & 2) == 0);
    }
    TextAnalyzer::lexer((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_68,
                        (string *)
                        &tmpV.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_88,
               separated.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,local_68,
               tmpV.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    std::fstream::close();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_68);
    if (tmpV.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&buffer._M_string_length) {
      operator_delete(tmpV.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      CONCAT71(buffer._M_string_length._1_7_,(undefined1)buffer._M_string_length) +
                      1);
    }
    std::fstream::~fstream(local_298);
  }
  local_298 = (undefined1  [8])((ulong)local_298 & 0xffffffffffffff00);
  TextAnalyzer::parse((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_88,(bool *)local_298);
  do {
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {
    vector<string> separated;
    if (argc == 2) { // from file
        fstream file;
        string buffer;
        file.open(argv[1], ios_base::in);
        if (!file.is_open()) {
            throw "cannot open file!";
        }
        getline(file, buffer);
        while (!file.eof()) {
            vector<string> tmpV = TextAnalyzer::lexer(buffer);
            separated.insert(separated.end(), tmpV.begin(), tmpV.end());
            getline(file, buffer);
        }
        vector<string> tmpV = TextAnalyzer::lexer(buffer);
        separated.insert(separated.end(), tmpV.begin(), tmpV.end());
        file.close();

    } else if (argc == 1) { // from users input
        string tmpS;
        getline(cin, tmpS);
        vector<string> tmpV = TextAnalyzer::lexer(tmpS);
        separated.insert(separated.end(), tmpV.begin(), tmpV.end());
    } else { //invalid arguments
        throw "invalid arguments!";
    }
    bool shouldStop = false;
    TextAnalyzer::parse(separated, shouldStop);
    while (true) {}
    return 0;
}